

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O2

void __thiscall
QPDFObjectHandle::addContentTokenFilter
          (QPDFObjectHandle *this,shared_ptr<QPDFObjectHandle::TokenFilter> *filter)

{
  allocator<char> local_59;
  QPDFObjectHandle local_58;
  __shared_ptr<QPDFObjectHandle::TokenFilter,_(__gnu_cxx::_Lock_policy)2> local_48;
  string local_38 [32];
  
  coalesceContentStreams(this);
  std::__cxx11::string::string<std::allocator<char>>(local_38,"/Contents",&local_59);
  getKey(&local_58,(string *)this);
  std::__shared_ptr<QPDFObjectHandle::TokenFilter,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_48,
             &filter->super___shared_ptr<QPDFObjectHandle::TokenFilter,_(__gnu_cxx::_Lock_policy)2>)
  ;
  addTokenFilter(&local_58,(shared_ptr<QPDFObjectHandle::TokenFilter> *)&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_58.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void
QPDFObjectHandle::addContentTokenFilter(std::shared_ptr<TokenFilter> filter)
{
    coalesceContentStreams();
    this->getKey("/Contents").addTokenFilter(filter);
}